

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_exception.c
# Opt level: O0

int exception_increment_reference(exception ex)

{
  int iVar1;
  long in_RDI;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    iVar1 = threading_atomic_ref_count_increment((threading_atomic_ref_count)(in_RDI + 0x28));
    if (iVar1 == 1) {
      local_4 = 1;
    }
    else {
      LOCK();
      exception_stats.increments = exception_stats.increments + 1;
      UNLOCK();
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int exception_increment_reference(exception ex)
{
	if (ex == NULL)
	{
		return 1;
	}

	if (threading_atomic_ref_count_increment(&ex->ref) == 1)
	{
		return 1;
	}

	reflect_memory_tracker_increment(exception_stats);

	return 0;
}